

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O2

StringResult<long_long> __thiscall
QCborStreamReaderPrivate::readStringChunk(QCborStreamReaderPrivate *this,ReadStringChunk params)

{
  CborValue *it;
  uint8_t *puVar1;
  long *plVar2;
  long lVar3;
  size_t utf8len;
  Code CVar4;
  Code CVar5;
  long lVar6;
  char *__dest;
  __off_t extraout_RDX;
  __off_t extraout_RDX_00;
  __off_t extraout_RDX_01;
  __off_t extraout_RDX_02;
  __off_t __length;
  undefined1 *puVar7;
  char *__file;
  long lVar8;
  undefined1 *puVar9;
  long in_FS_OFFSET;
  ReadStringChunk params_00;
  ReadStringChunk params_01;
  StringResult<long_long> SVar10;
  undefined8 uStack_60;
  size_t len;
  undefined1 *local_40;
  long local_38;
  
  params_00.field_0 = params.field_0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  len = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  (this->lastError).c = NoError;
  ensureStringIteration(this);
  it = &this->currentElement;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  CVar4 = get_string_chunk_size(it,(size_t *)&local_40,&len);
  puVar7 = local_40;
  utf8len = len;
  if (((CVar4 != NoError) || (CVar4 = DataTooLarge, (long)len < 0)) ||
     (puVar9 = local_40 + len, SCARRY8((long)local_40,len))) {
    puVar7 = (undefined1 *)0x0;
  }
  else {
    plVar2 = (long *)(this->currentElement).source.ptr;
    if ((long *)*plVar2 == (long *)0x0) {
      lVar6 = plVar2[3];
    }
    else {
      lVar6 = (**(code **)(*(long *)*plVar2 + 0xa0))();
    }
    CVar4 = EndOfFile;
    if ((long)puVar9 <= lVar6 - plVar2[0xd]) {
      puVar1 = &(this->currentElement).flags;
      *puVar1 = *puVar1 & 0xfb;
      CVar4 = NoError;
    }
  }
  CVar5 = DataTooLarge;
  if (-1 < (long)utf8len) {
    CVar5 = CVar4;
  }
  if (CVar4 != NoError) {
    CVar5 = CVar4;
  }
  if (CVar5 == NoError) {
    lVar6 = this->bufferStart;
    this->bufferStart = (size_type)(puVar7 + lVar6);
    if (this->device != (QIODevice *)0x0) {
      QIODevice::skip(this->device,(qint64)(puVar7 + lVar6));
    }
    if (params.maxlen_or_type == -5) {
      params_01.maxlen_or_type = -5;
      params_01.field_0.ptr = params_00.field_0.ptr;
      lVar6 = readStringChunk_utf8(this,params_01,utf8len);
      __length = extraout_RDX_00;
    }
    else if (params.maxlen_or_type == -3) {
      params_00.maxlen_or_type = -3;
      lVar6 = readStringChunk_unicode(this,params_00,utf8len);
      __length = extraout_RDX;
    }
    else {
      lVar6 = readStringChunk_byte(this,params,utf8len);
      __length = extraout_RDX_01;
    }
    if (lVar6 < 0) {
      uStack_60 = 0xffffffffffffffff;
    }
    else {
      lVar8 = utf8len + this->bufferStart;
      this->bufferStart = lVar8;
      if (this->device != (QIODevice *)0x0) {
        lVar3 = (this->buffer).d.size;
        __file = (char *)(lVar3 - lVar8);
        if (__file == (char *)0x0 || lVar3 < lVar8) {
          __file = (char *)0x0;
        }
        else {
          __dest = QByteArray::data(&this->buffer);
          memmove(__dest,__dest + this->bufferStart,(size_t)__file);
          __length = extraout_RDX_02;
        }
        QByteArray::truncate(&this->buffer,__file,__length);
        this->bufferStart = 0;
      }
      preread(this);
      uStack_60 = 1;
    }
  }
  else {
    if (CVar5 == (IllegalSimpleType|UnknownError)) {
      preread(this);
      if (((this->currentElement).flags & 0x10) != 0) {
        advance_bytes(it,1);
      }
      CVar5 = preparse_next_value(it);
      uStack_60 = 0;
    }
    else {
      uStack_60 = 0xffffffffffffffff;
    }
    if (CVar5 == NoError) {
      lVar6 = 0;
    }
    else {
      if (CVar5 != EndOfFile) {
        this->corrupt = true;
      }
      (this->lastError).c = CVar5;
      lVar6 = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  SVar10._8_8_ = uStack_60;
  SVar10.data = lVar6;
  return SVar10;
}

Assistant:

Q_NEVER_INLINE QCborStreamReader::StringResult<qsizetype>
QCborStreamReaderPrivate::readStringChunk(ReadStringChunk params)
{
    CborError err;
    size_t len;
    const void *content = nullptr;
    QCborStreamReader::StringResult<qsizetype> result;
    result.data = 0;
    result.status = QCborStreamReader::Error;

    lastError = {};
    if (!ensureStringIteration())
        return result;

    // Note: in the current implementation, the call into TinyCBOR below only
    // succeeds if we *already* have all the data in memory. That's obvious for
    // the case of direct memory (no QIODevice), whereas for QIODevices
    // qt_cbor_decoder_transfer_string() enforces that
    // QIODevice::bytesAvailable() be bigger than the amount we're about to
    // read.
    //
    // This is an important security gate: if the CBOR stream is corrupt or
    // malicious, and has an impossibly large string size, we only go past it
    // if the transfer to the destination buffer will succeed (modulo QIODevice
    // I/O failures).

#if 1
    // Using internal TinyCBOR API!
    err = _cbor_value_get_string_chunk(&currentElement, &content, &len, &currentElement);
#else
    // the above is effectively the same as:
    if (cbor_value_is_byte_string(&currentElement))
        err = cbor_value_get_byte_string_chunk(&currentElement, reinterpret_cast<const uint8_t **>(&content),
                                               &len, &currentElement);
    else
        err = cbor_value_get_text_string_chunk(&currentElement, reinterpret_cast<const char **>(&content),
                                               &len, &currentElement);
#endif

    // Range check: using implementation-defined behavior in converting an
    // unsigned value out of range of the destination signed type (same as
    // "len > size_t(std::numeric_limits<qsizetype>::max())", but generates
    // better code with ICC and MSVC).
    if (!err && qsizetype(len) < 0)
        err = CborErrorDataTooLarge;

    if (err) {
        if (err == CborErrorNoMoreStringChunks) {
            preread();
            err = cbor_value_finish_string_iteration(&currentElement);
            result.status = QCborStreamReader::EndOfString;
        }
        if (err)
            handleError(err);
        // caller musts call preparse()
        return result;
    }

    qptrdiff offset = qptrdiff(content);
    bufferStart += offset;
    if (device) {
        // This first skip can't fail because we've already read this many bytes.
        device->skip(bufferStart);
    }

    if (params.isString()) {
        // readString()
        result.data = readStringChunk_unicode(params, qsizetype(len));
    } else if (params.isUtf8String()) {
        result.data = readStringChunk_utf8(params, qsizetype(len));
    } else {
        // readByteArray() or readStringChunk()
        result.data = readStringChunk_byte(params, qsizetype(len));
    }

    if (result.data < 0)
        return result;      // error

    // adjust the buffers after we're done reading the string
    bufferStart += len;
    if (device) {
        qsizetype remainingInBuffer = buffer.size() - bufferStart;

        if (remainingInBuffer <= 0) {
            // We've read from the QIODevice more than what was in the buffer.
            buffer.truncate(0);
        } else {
            // There's still data buffered, but we need to move it around.
            char *ptr = buffer.data();
            memmove(ptr, ptr + bufferStart, remainingInBuffer);
            buffer.truncate(remainingInBuffer);
        }

        bufferStart = 0;
    }

    preread();
    result.status = QCborStreamReader::Ok;
    return result;
}